

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::Tree::_copy_props_wo_key(Tree *this,size_t dst_,Tree *that_tree,size_t src_)

{
  Tree *unaff_retaddr;
  NodeData *src;
  NodeData *dst;
  undefined1 local_58 [8];
  NodeData *local_50;
  NodeData *local_48;
  NodeData *local_20;
  NodeType_e local_18;
  undefined1 *local_10;
  size_t in_stack_fffffffffffffff8;
  
  local_48 = _p(unaff_retaddr,in_stack_fffffffffffffff8);
  local_50 = _p(unaff_retaddr,in_stack_fffffffffffffff8);
  local_20 = local_48;
  local_18 = (local_50->m_type).type & ~_KEYMASK | (local_48->m_type).type & _KEYMASK;
  (local_48->m_type).type = local_18;
  local_10 = local_58;
  memcpy(&local_48->m_val,&local_50->m_val,0x30);
  return;
}

Assistant:

void _copy_props_wo_key(size_t dst_, Tree const* that_tree, size_t src_)
    {
        auto      & C4_RESTRICT dst = *_p(dst_);
        auto const& C4_RESTRICT src = *that_tree->_p(src_);
        dst.m_type = (src.m_type & ~_KEYMASK) | (dst.m_type & _KEYMASK);
        dst.m_val  = src.m_val;
    }